

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.h
# Opt level: O0

void __thiscall WebServer::~WebServer(WebServer *this)

{
  WebServer *this_local;
  
  std::shared_ptr<SQLConnection>::~shared_ptr(&this->sql);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&this->users);
  MutexLock::~MutexLock(&this->mutex_);
  HttpConnPool::~HttpConnPool(&this->connPool_);
  std::shared_ptr<Channel>::~shared_ptr(&this->acceptChannel_);
  std::unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>::~unique_ptr
            (&this->reactorPool_);
  return;
}

Assistant:

~WebServer() {}